

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestFailedDepsParse::Run(BuildTestFailedDepsParse *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Node *pNVar6;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  uint local_78;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string err;
  int fail_count;
  BuildTestFailedDepsParse *this_local;
  
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 0xc));
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "build bad_deps.o: cat in1\n  deps = gcc\n  depfile = in1.d\n",stack0xffffffffffffffe4
             );
  iVar5 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar5) {
    std::__cxx11::string::string((string *)local_40);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"bad_deps.o",&local_61);
    pNVar6 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_60,(string *)local_40);
    testing::Test::Check
              (pTVar1,pNVar6 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x748,"builder_.AddTarget(\"bad_deps.o\", &err)");
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x749,"\"\" == err");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"in1.d",&local_99);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"AAA BBB",&local_c1);
      VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_98,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      pTVar1 = g_current_test;
      bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_40);
      testing::Test::Check
                (pTVar1,(bool)(~bVar3 & 1),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x74f,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar3 = std::operator==("subcommand failed",
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x750,"\"subcommand failed\" == err");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    local_78 = (uint)!bVar2;
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, FailedDepsParse) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build bad_deps.o: cat in1\n"
"  deps = gcc\n"
"  depfile = in1.d\n"));

  string err;
  EXPECT_TRUE(builder_.AddTarget("bad_deps.o", &err));
  ASSERT_EQ("", err);

  // These deps will fail to parse, as they should only have one
  // path to the left of the colon.
  fs_.Create("in1.d", "AAA BBB");

  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("subcommand failed", err);
}